

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdsForge.cpp
# Opt level: O0

void __thiscall gdsForge::gdsBegin(gdsForge *this)

{
  int *arrInt;
  allocator<char> local_39;
  string local_38;
  int local_14;
  gdsForge *pgStack_10;
  int tempArr [1];
  gdsForge *this_local;
  
  local_14 = 600;
  pgStack_10 = this;
  GDSwriteInt(this,2,&local_14,1);
  arrInt = gsdTime();
  GDSwriteInt(this,0x102,arrInt,0xc);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"ColdFlux.db",&local_39);
  GDSwriteStr(this,0x206,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  GDSwriteUnits(this);
  return;
}

Assistant:

void gdsForge::gdsBegin()
{
  int tempArr[1];

  tempArr[0] = 600;
  this->GDSwriteInt(GDS_HEADER, tempArr, 1);

  this->GDSwriteInt(GDS_BGNLIB, gsdTime(), 12);

  this->GDSwriteStr(GDS_LIBNAME, "ColdFlux.db");

  this->GDSwriteUnits();
  // Precision error, ultra fine...
  // double dArr[2] = {0.001, 1e-9};
  // GDSwriteRea(GDS_UNITS, dArr, 2);
}